

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O3

int mbedtls_md5_update_ret(mbedtls_md5_context *ctx,uchar *input,size_t ilen)

{
  uint uVar1;
  uint uVar2;
  ulong __n;
  ulong uVar3;
  
  if (ilen == 0) {
    return 0;
  }
  uVar1 = ctx->total[0];
  uVar2 = uVar1 & 0x3f;
  uVar3 = (ulong)uVar2;
  ctx->total[0] = (uint)ilen + uVar1;
  if (CARRY4((uint)ilen,uVar1)) {
    ctx->total[1] = ctx->total[1] + 1;
  }
  if (uVar2 != 0) {
    __n = 0x40 - uVar3;
    if (ilen < __n) goto LAB_0010795d;
    memcpy(ctx->buffer + uVar2,input,__n);
    mbedtls_internal_md5_process(ctx,ctx->buffer);
    input = input + __n;
    ilen = ilen - __n;
  }
  for (; 0x3f < ilen; ilen = ilen - 0x40) {
    mbedtls_internal_md5_process(ctx,input);
    input = input + 0x40;
  }
  uVar3 = 0;
  if (ilen == 0) {
    return 0;
  }
LAB_0010795d:
  memcpy(ctx->buffer + uVar3,input,ilen);
  return 0;
}

Assistant:

int mbedtls_md5_update_ret( mbedtls_md5_context *ctx,
                            const unsigned char *input,
                            size_t ilen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t fill;
    uint32_t left;

    if( ilen == 0 )
        return( 0 );

    left = ctx->total[0] & 0x3F;
    fill = 64 - left;

    ctx->total[0] += (uint32_t) ilen;
    ctx->total[0] &= 0xFFFFFFFF;

    if( ctx->total[0] < (uint32_t) ilen )
        ctx->total[1]++;

    if( left && ilen >= fill )
    {
        memcpy( (void *) (ctx->buffer + left), input, fill );
        if( ( ret = mbedtls_internal_md5_process( ctx, ctx->buffer ) ) != 0 )
            return( ret );

        input += fill;
        ilen  -= fill;
        left = 0;
    }

    while( ilen >= 64 )
    {
        if( ( ret = mbedtls_internal_md5_process( ctx, input ) ) != 0 )
            return( ret );

        input += 64;
        ilen  -= 64;
    }

    if( ilen > 0 )
    {
        memcpy( (void *) (ctx->buffer + left), input, ilen );
    }

    return( 0 );
}